

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartTls-Example.cpp
# Opt level: O2

void ServerThread(bool *bStop)

{
  bool bClientConnected;
  TcpServer sock;
  byte local_d1;
  BaseSocket local_d0;
  duration<long,_std::ratio<1L,_1000L>_> local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  function<void_(BaseSocket_*)> local_50;
  function<void_(BaseSocket_*)> local_30;
  
  TcpServer::TcpServer((TcpServer *)&local_d0);
  local_d1 = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:44:28)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:44:28)>
             ::_M_manager;
  BaseSocket::BindErrorFunction(&local_30,&local_d0,(function<void_(BaseSocket_*)> *)&local_98);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:45:28)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:45:28)>
             ::_M_manager;
  BaseSocket::BindCloseFunction(&local_50,&local_d0,(function<void_(BaseSocket_*)> *)&local_b8);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  local_70._8_8_ = 0;
  local_70._M_unused._M_object = &local_d1;
  local_58 = std::
             _Function_handler<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:47:28)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:47:28)>
             ::_M_manager;
  TcpServer::BindNewConnection
            ((TcpServer *)&local_d0,
             (function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)> *)
             &local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  TcpServer::Start((TcpServer *)&local_d0,"0.0.0.0",0xd85);
  while ((*bStop == false || ((local_d1 & 1) != 0))) {
    local_c0.__r = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_c0);
  }
  TcpServer::Close((TcpServer *)&local_d0);
  BaseSocket::~BaseSocket(&local_d0);
  return;
}

Assistant:

void ServerThread(const bool* bStop)
{
    TcpServer sock;
    bool bClientConnected = false;

    // 3 callback function to handle the server socket events
    sock.BindErrorFunction([&](BaseSocket* pSock) { cout << "Server: socket error" << endl << flush; pSock->Close(); }); // Must call Close function
    sock.BindCloseFunction([&](BaseSocket*) { cout << "Server: socket closing" << endl << flush; });

    sock.BindNewConnection([&](const vector<TcpSocket*>& lstSockets)
    {
        // a list with sockets new connected
        for (auto& pSocket : lstSockets)
        {
            if (pSocket != nullptr)
            {
                bClientConnected = true;

                // 3 callback functions to handle the sockets events
                pSocket->BindFuncBytesReceived([&](TcpSocket* pSock)
                {
                    const size_t nAvalible = pSock->GetBytesAvailable();

                    if (nAvalible == 0) // Socket closed on remote
                    {
                        pSock->Close();
                        return;
                    }

                    auto spBuffer = make_unique<uint8_t[]>(nAvalible + 1);

                    const size_t nRead = pSock->Read(spBuffer.get(), nAvalible);

                    if (nRead > 0)
                    {
                        string strRec(nRead, 0);
                        copy(&spBuffer[0], &spBuffer[nRead], &strRec[0]);

                        if (strRec == "STARTTLS")
                        {
                            SslTcpSocket* pSslTcpSocket = SslTcpSocket::SwitchToSll(pSock);
                            pSock->SelfDestroy();
                            if (pSslTcpSocket->AddServerCertificate("certs/ca-root.crt", "certs/127-0-0-1.crt", "certs/127-0-0-1-key.pem", nullptr) == false)
                            {
                                cout << "Server: can't load certificate" << endl;
                                pSslTcpSocket->Close();
                                return;
                            }
                            pSslTcpSocket->SetAcceptState();
                            pSslTcpSocket->StartReceiving();
                            pSslTcpSocket->Write("Server Hello Message with TLS", 29);
                            return;
                        }

                        stringstream strOutput;
                        strOutput << pSock->GetClientAddr() << " - Server received: " << nRead << " Bytes, \"" << strRec << "\"" << endl;

                        cout << strOutput.str() << flush;

                        strRec = "Server echo: " + strRec;
                        pSock->Write(&strRec[0], strRec.size());

                        //pSock->Close(); // Optional, if you don't close the socket, the connection stays open
                    }
                });
                pSocket->BindErrorFunction([&](BaseSocket* pSock)
                {
                    // there was an error, we close the socket
                    pSock->Close();
                    cout << "Server: accept socket error" << endl << flush;
                });
                pSocket->BindCloseFunction([&](BaseSocket* pSock)
                {
                    // We let the socket destroy it self, use this on sockets received by the server
                    bClientConnected = false;
                    cout << "Server: accept socket closing" << endl << flush;
                });

                pSocket->StartReceiving();  // start to receive data
                pSocket->Write("Server Hello Message none TLS", 29);
            }
        }
    });


    // start der server socket
    const bool bCreated = sock.Start("0.0.0.0", 3461);    // IPv6 use "::1" as address

    while (*bStop == false || bClientConnected == true)
    {
        this_thread::sleep_for(chrono::milliseconds(10));
    }

    // Closing the server socket will not call the close callback
    sock.Close();
}